

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeReset(Vdbe *p)

{
  sqlite3 *db_00;
  sqlite3 *db;
  Vdbe *p_local;
  
  db_00 = p->db;
  sqlite3VdbeHalt(p);
  if (p->pc < 0) {
    if ((p->rc != 0) && ((*(ushort *)&p->field_0x9a >> 5 & 1) != 0)) {
      sqlite3Error(db_00,p->rc,(char *)0x0);
      sqlite3ValueSetStr(db_00->pErr,-1,p->zErrMsg,'\x01',(_func_void_void_ptr *)0xffffffffffffffff)
      ;
      sqlite3DbFree(db_00,p->zErrMsg);
      p->zErrMsg = (char *)0x0;
    }
  }
  else {
    sqlite3VdbeTransferError(p);
    sqlite3DbFree(db_00,p->zErrMsg);
    p->zErrMsg = (char *)0x0;
    if ((*(ushort *)&p->field_0x9a >> 6 & 1) != 0) {
      *(ushort *)&p->field_0x9a = *(ushort *)&p->field_0x9a & 0xffdf | 0x20;
    }
  }
  Cleanup(p);
  p->magic = 0x26bceaa5;
  return p->rc & db_00->errMask;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeReset(Vdbe *p){
  sqlite3 *db;
  db = p->db;

  /* If the VM did not run to completion or if it encountered an
  ** error, then it might not have been halted properly.  So halt
  ** it now.
  */
  sqlite3VdbeHalt(p);

  /* If the VDBE has be run even partially, then transfer the error code
  ** and error message from the VDBE into the main database structure.  But
  ** if the VDBE has just been set to run but has not actually executed any
  ** instructions yet, leave the main database error information unchanged.
  */
  if( p->pc>=0 ){
    vdbeInvokeSqllog(p);
    sqlite3VdbeTransferError(p);
    sqlite3DbFree(db, p->zErrMsg);
    p->zErrMsg = 0;
    if( p->runOnlyOnce ) p->expired = 1;
  }else if( p->rc && p->expired ){
    /* The expired flag was set on the VDBE before the first call
    ** to sqlite3_step(). For consistency (since sqlite3_step() was
    ** called), set the database error in this case as well.
    */
    sqlite3Error(db, p->rc, 0);
    sqlite3ValueSetStr(db->pErr, -1, p->zErrMsg, SQLITE_UTF8, SQLITE_TRANSIENT);
    sqlite3DbFree(db, p->zErrMsg);
    p->zErrMsg = 0;
  }

  /* Reclaim all memory used by the VDBE
  */
  Cleanup(p);

  /* Save profiling information from this VDBE run.
  */
#ifdef VDBE_PROFILE
  {
    FILE *out = fopen("vdbe_profile.out", "a");
    if( out ){
      int i;
      fprintf(out, "---- ");
      for(i=0; i<p->nOp; i++){
        fprintf(out, "%02x", p->aOp[i].opcode);
      }
      fprintf(out, "\n");
      for(i=0; i<p->nOp; i++){
        fprintf(out, "%6d %10lld %8lld ",
           p->aOp[i].cnt,
           p->aOp[i].cycles,
           p->aOp[i].cnt>0 ? p->aOp[i].cycles/p->aOp[i].cnt : 0
        );
        sqlite3VdbePrintOp(out, i, &p->aOp[i]);
      }
      fclose(out);
    }
  }
#endif
  p->magic = VDBE_MAGIC_INIT;
  return p->rc & db->errMask;
}